

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestGenericHandler::StartLogFile
          (cmCTestGenericHandler *this,char *name,cmGeneratedFileStream *xofs)

{
  cmCTest *pcVar1;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_588 [32];
  string local_568 [32];
  undefined1 local_548 [8];
  ostringstream cmCTestLog_msg_1;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  string local_388;
  string local_368;
  undefined1 local_348 [8];
  ostringstream ostr;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream *xofs_local;
  char *name_local;
  cmCTestGenericHandler *this_local;
  
  if (name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar4 = std::operator<<((ostream *)local_1a0,
                             "Cannot create log file without providing the name");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x78,pcVar5,false);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
    poVar4 = std::operator<<((ostream *)local_348,"Last");
    std::operator<<(poVar4,name);
    if (0 < this->SubmitIndex) {
      poVar4 = std::operator<<((ostream *)local_348,"_");
      std::ostream::operator<<(poVar4,this->SubmitIndex);
    }
    cmCTest::GetCurrentTag_abi_cxx11_(&local_368,this->CTest);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_368);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      poVar4 = std::operator<<((ostream *)local_348,"_");
      cmCTest::GetCurrentTag_abi_cxx11_(&local_388,this->CTest);
      std::operator<<(poVar4,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
    }
    std::operator<<((ostream *)local_348,".log");
    pcVar1 = this->CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,"Temporary",&local_3a9);
    std::__cxx11::ostringstream::str();
    bVar3 = cmCTest::OpenOutputFile(pcVar1,&local_3a8,&local_3d0,xofs,false);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_548);
      poVar4 = std::operator<<((ostream *)local_548,"Cannot create log file: ");
      std::__cxx11::ostringstream::str();
      poVar4 = std::operator<<(poVar4,local_568);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_568);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                   ,0x86,pcVar5,false);
      std::__cxx11::string::~string(local_588);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_548);
    }
    this_local._7_1_ = !bVar3;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestGenericHandler::StartLogFile(const char* name,
                                         cmGeneratedFileStream& xofs)
{
  if (!name) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file without providing the name"
                 << std::endl;);
    return false;
  }
  std::ostringstream ostr;
  ostr << "Last" << name;
  if (this->SubmitIndex > 0) {
    ostr << "_" << this->SubmitIndex;
  }
  if (!this->CTest->GetCurrentTag().empty()) {
    ostr << "_" << this->CTest->GetCurrentTag();
  }
  ostr << ".log";
  if (!this->CTest->OpenOutputFile("Temporary", ostr.str(), xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: " << ostr.str() << std::endl);
    return false;
  }
  return true;
}